

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_long>,long,duckdb::BitAndOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  char *pcVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  idx_t iVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      pcVar2 = *(char **)states->data;
      if (*pcVar2 == '\0') {
        *(ulong *)(pcVar2 + 8) = *(ulong *)input->data;
        *pcVar2 = '\x01';
      }
      else {
        *(ulong *)(pcVar2 + 8) = *(ulong *)(pcVar2 + 8) & *(ulong *)input->data;
      }
    }
  }
  else if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    pdVar4 = states->data;
    FlatVector::VerifyFlatVector(input);
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      if (count != 0) {
        iVar8 = 0;
        do {
          pcVar2 = *(char **)(pdVar4 + iVar8 * 8);
          if (*pcVar2 == '\0') {
            *(ulong *)(pcVar2 + 8) = *(ulong *)(pdVar3 + iVar8 * 8);
            *pcVar2 = '\x01';
          }
          else {
            *(ulong *)(pcVar2 + 8) = *(ulong *)(pcVar2 + 8) & *(ulong *)(pdVar3 + iVar8 * 8);
          }
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar9 = 0;
      uVar10 = 0;
      do {
        uVar5 = puVar1[uVar9];
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
        uVar11 = uVar12;
        if (uVar5 != 0) {
          uVar11 = uVar10;
          if (uVar5 == 0xffffffffffffffff) {
            if (uVar10 < uVar12) {
              do {
                pcVar2 = *(char **)(pdVar4 + uVar11 * 8);
                if (*pcVar2 == '\0') {
                  *(ulong *)(pcVar2 + 8) = *(ulong *)(pdVar3 + uVar11 * 8);
                  *pcVar2 = '\x01';
                }
                else {
                  *(ulong *)(pcVar2 + 8) = *(ulong *)(pcVar2 + 8) & *(ulong *)(pdVar3 + uVar11 * 8);
                }
                uVar11 = uVar11 + 1;
              } while (uVar12 != uVar11);
            }
          }
          else if (uVar10 < uVar12) {
            uVar11 = 0;
            do {
              if ((uVar5 >> (uVar11 & 0x3f) & 1) != 0) {
                pcVar2 = *(char **)(pdVar4 + uVar11 * 8 + uVar10 * 8);
                if (*pcVar2 == '\0') {
                  *(ulong *)(pcVar2 + 8) = *(ulong *)(pdVar3 + uVar11 * 8 + uVar10 * 8);
                  *pcVar2 = '\x01';
                }
                else {
                  *(ulong *)(pcVar2 + 8) =
                       *(ulong *)(pcVar2 + 8) & *(ulong *)(pdVar3 + uVar11 * 8 + uVar10 * 8);
                }
              }
              uVar11 = uVar11 + 1;
            } while ((uVar10 - uVar12) + uVar11 != 0);
            uVar11 = uVar10 + uVar11;
          }
        }
        uVar9 = uVar9 + 1;
        uVar10 = uVar11;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_b8);
    Vector::ToUnifiedFormat(states,count,&local_70);
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar6 = (local_b8.sel)->sel_vector;
        psVar7 = (local_70.sel)->sel_vector;
        iVar8 = 0;
        do {
          iVar13 = iVar8;
          if (psVar6 != (sel_t *)0x0) {
            iVar13 = (idx_t)psVar6[iVar8];
          }
          iVar14 = iVar8;
          if (psVar7 != (sel_t *)0x0) {
            iVar14 = (idx_t)psVar7[iVar8];
          }
          pcVar2 = *(char **)(local_70.data + iVar14 * 8);
          if (*pcVar2 == '\0') {
            *(ulong *)(pcVar2 + 8) = *(ulong *)(local_b8.data + iVar13 * 8);
            *pcVar2 = '\x01';
          }
          else {
            *(ulong *)(pcVar2 + 8) = *(ulong *)(pcVar2 + 8) & *(ulong *)(local_b8.data + iVar13 * 8)
            ;
          }
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    else if (count != 0) {
      psVar6 = (local_b8.sel)->sel_vector;
      psVar7 = (local_70.sel)->sel_vector;
      iVar8 = 0;
      do {
        iVar13 = iVar8;
        if (psVar6 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar6[iVar8];
        }
        iVar14 = iVar8;
        if (psVar7 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar7[iVar8];
        }
        if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar13 >> 6]
             >> (iVar13 & 0x3f) & 1) != 0) {
          pcVar2 = *(char **)(local_70.data + iVar14 * 8);
          if (*pcVar2 == '\0') {
            *(ulong *)(pcVar2 + 8) = *(ulong *)(local_b8.data + iVar13 * 8);
            *pcVar2 = '\x01';
          }
          else {
            *(ulong *)(pcVar2 + 8) = *(ulong *)(pcVar2 + 8) & *(ulong *)(local_b8.data + iVar13 * 8)
            ;
          }
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b8.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}